

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::
Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::
get_scalar(Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
           *this,vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *v)

{
  if (((v != (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x0) &&
      (this->_blocked == false)) && (this->_has_value == true)) {
    ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator=
              (v,&this->_value);
    return true;
  }
  return false;
}

Assistant:

bool get_scalar(T *v) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    } else if (has_value()) {
      (*v) = _value;
      return true;
    }

    // timesamples
    return false;
  }